

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void cfl_idx_to_sign_and_alpha(int cfl_idx,CFL_SIGN_TYPE *cfl_sign,int *cfl_alpha)

{
  CFL_SIGN_TYPE CVar1;
  int iVar2;
  int cfl_linear_idx;
  int *cfl_alpha_local;
  CFL_SIGN_TYPE *cfl_sign_local;
  int cfl_idx_local;
  
  iVar2 = cfl_idx + -0x10;
  if (iVar2 == 0) {
    *cfl_sign = '\0';
    *cfl_alpha = 0;
  }
  else {
    CVar1 = '\x01';
    if (0 < iVar2) {
      CVar1 = '\x02';
    }
    *cfl_sign = CVar1;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    *cfl_alpha = iVar2 + -1;
  }
  return;
}

Assistant:

static void cfl_idx_to_sign_and_alpha(int cfl_idx, CFL_SIGN_TYPE *cfl_sign,
                                      int *cfl_alpha) {
  int cfl_linear_idx = cfl_idx - CFL_INDEX_ZERO;
  if (cfl_linear_idx == 0) {
    *cfl_sign = CFL_SIGN_ZERO;
    *cfl_alpha = 0;
  } else {
    *cfl_sign = cfl_linear_idx > 0 ? CFL_SIGN_POS : CFL_SIGN_NEG;
    *cfl_alpha = abs(cfl_linear_idx) - 1;
  }
}